

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

bool cmCMakePresetsGraphInternal::PresetBoolHelper(bool *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  cmJSONState *local_40;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  if (PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    if (iVar2 != 0) {
      local_38[1] = (code *)0x0;
      local_38[0] = JsonErrors::INVALID_BOOL;
      local_20 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::Bool(&PresetBoolHelper::helper,(ErrorGenerator *)local_38,false);
      if (local_28 != (_Manager_type)0x0) {
        (*local_28)((_Any_data *)local_38,(_Any_data *)local_38,__destroy_functor);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    }
  }
  local_40 = state;
  local_38[0] = (code *)value;
  if (PresetBoolHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetBoolHelper::helper._M_invoker)
                      ((_Any_data *)&PresetBoolHelper::helper,out,(Value **)local_38,&local_40);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetBoolHelper(bool& out, const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Bool();
  return helper(out, value, state);
}